

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void opj_image_destroy(opj_image_t *image)

{
  void *__ptr;
  uint uVar1;
  opj_image_comp_t *__ptr_00;
  long lVar2;
  ulong uVar3;
  
  if (image != (opj_image_t *)0x0) {
    __ptr_00 = image->comps;
    if (__ptr_00 != (opj_image_comp_t *)0x0) {
      uVar1 = image->numcomps;
      if (uVar1 != 0) {
        lVar2 = 0x30;
        uVar3 = 0;
        do {
          __ptr = *(void **)((long)&image->comps->dx + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            uVar1 = image->numcomps;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x38;
        } while (uVar3 < uVar1);
        __ptr_00 = image->comps;
      }
      free(__ptr_00);
    }
    if (image->icc_profile_buf != (OPJ_BYTE *)0x0) {
      free(image->icc_profile_buf);
    }
    free(image);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_image_destroy(opj_image_t *image) {
	if(image) {
		if(image->comps) {
			OPJ_UINT32 compno;

			/* image components */
			for(compno = 0; compno < image->numcomps; compno++) {
				opj_image_comp_t *image_comp = &(image->comps[compno]);
				if(image_comp->data) {
					opj_free(image_comp->data);
				}
			}
			opj_free(image->comps);
		}

		if(image->icc_profile_buf) {
			opj_free(image->icc_profile_buf);
		}

		opj_free(image);
	}
}